

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib4plus.hpp
# Opt level: O1

void __thiscall
trng::lagfib4plus<unsigned_long,_168U,_205U,_242U,_521U>::seed<trng::minstd>
          (lagfib4plus<unsigned_long,_168U,_205U,_242U,_521U> *this,minstd *g)

{
  uint uVar1;
  uint i;
  long lVar2;
  uint uVar3;
  int iVar4;
  result_type rVar5;
  ulong uVar6;
  
  uVar3 = (g->S).r;
  lVar2 = 0;
  do {
    iVar4 = 0x40;
    rVar5 = 0;
    do {
      uVar6 = ((ulong)uVar3 * 0x41a7 >> 0x1f) + ((ulong)uVar3 * 0x41a7 & 0x7fffffff);
      uVar1 = (uint)uVar6;
      uVar3 = uVar1 + 0x80000001;
      if (uVar6 < 0x7fffffff) {
        uVar3 = uVar1;
      }
      rVar5 = (ulong)(uVar3 + 0xbfffffff < 0xc0000000) + rVar5 * 2;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    (this->S).r[lVar2] = rVar5;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x209);
  (g->S).r = uVar3;
  (this->S).index = 0x208;
  return;
}

Assistant:

void seed(gen &g) {
      for (unsigned int i{0}; i < D; ++i) {
        result_type r{0};
        for (int j{0}; j < std::numeric_limits<result_type>::digits; ++j) {
          r <<= 1;
          if (g() - gen::min() > gen::max() / 2)
            ++r;
        }
        S.r[i] = r;
      }
      S.index = D - 1;
    }